

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O1

SRes Lzma2Dec_DecodeToDic
               (CLzma2Dec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  SizeT *pSVar1;
  UInt32 *pUVar2;
  UInt32 UVar3;
  SizeT SVar4;
  SizeT SVar5;
  byte bVar6;
  int __result__;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  SizeT SVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  UInt32 UVar15;
  SRes unaff_R15D;
  SRes SVar16;
  bool bVar17;
  bool bVar18;
  SizeT srcSizeCur;
  ulong local_58;
  SizeT local_50;
  SizeT *local_48;
  byte *local_40;
  ELzmaStatus *local_38;
  
  SVar11 = *srcLen;
  *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  uVar10 = p->state;
  local_50 = SVar11;
  local_48 = srcLen;
  do {
    if (uVar10 == 8) {
      *status = LZMA_STATUS_FINISHED_WITH_MARK;
      return 0;
    }
    if (uVar10 == 9) {
      bVar9 = true;
      unaff_R15D = 1;
      goto LAB_005d1e92;
    }
    SVar4 = (p->decoder).dicPos;
    uVar8 = dicLimit - SVar4;
    if (uVar8 == 0 && finishMode == LZMA_FINISH_ANY) {
      *status = LZMA_STATUS_NOT_FINISHED;
LAB_005d1e89:
      bVar9 = true;
      unaff_R15D = 0;
    }
    else {
      if ((uVar10 & 0xfffffffe) != 6) {
        if (*srcLen != SVar11) {
          *srcLen = *srcLen + 1;
          uVar7 = 9;
          if (uVar10 < 6) {
            bVar6 = *src;
            uVar14 = (uint)bVar6;
            switch(uVar10) {
            case 0:
              p->control = bVar6;
              if (bVar6 == 0) {
                uVar7 = 8;
              }
              else {
                if ((char)bVar6 < '\0') {
                  p->unpackSize = (bVar6 & 0x1f) << 0x10;
                }
                else {
                  if (2 < bVar6) break;
                  p->unpackSize = 0;
                }
                uVar7 = 1;
              }
              break;
            case 1:
              p->unpackSize = p->unpackSize | (uint)bVar6 << 8;
              uVar7 = 2;
              break;
            case 2:
              p->unpackSize = (uVar14 | p->unpackSize) + 1;
              uVar7 = (uint)(-1 < (char)p->control) * 3 + 3;
              break;
            case 3:
              p->packSize = uVar14 << 8;
              uVar7 = 4;
              break;
            case 4:
              p->packSize = (uVar14 | p->packSize) + 1;
              uVar7 = 5;
              if ((p->control & 0x40) == 0) {
                uVar7 = (uint)(p->needInitProp != 0) * 3 + 6;
              }
              break;
            case 5:
              if (bVar6 < 0xe1) {
                uVar14 = uVar14 / 9;
                uVar10 = (uint)(byte)(bVar6 + (char)uVar14 * -9);
                (p->decoder).prop.pb = uVar14 / 5;
                if (uVar14 % 5 + uVar10 < 5) {
                  (p->decoder).prop.lc = uVar10;
                  (p->decoder).prop.lp = uVar14 % 5;
                  p->needInitProp = 0;
                  uVar7 = 6;
                }
              }
            }
          }
          src = src + 1;
          bVar17 = dicLimit == SVar4;
          bVar18 = uVar7 != 8;
          bVar9 = bVar18 && bVar17;
          if (bVar18 && bVar17) {
            uVar7 = 9;
          }
          p->state = uVar7;
          if (bVar18 && bVar17) {
            unaff_R15D = 1;
          }
          goto LAB_005d1e92;
        }
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        goto LAB_005d1e89;
      }
      local_58 = SVar11 - *srcLen;
      uVar12 = (ulong)p->unpackSize;
      uVar13 = uVar12;
      if (uVar12 > uVar8) {
        uVar13 = uVar8;
      }
      bVar6 = p->control;
      if ((char)bVar6 < '\0') {
        SVar16 = unaff_R15D;
        if (uVar10 == 6) {
          bVar6 = bVar6 >> 5 & 3;
          local_40 = src;
          if (((bVar6 == 3) || (p->needInitDic == 0)) && ((bVar6 != 0 || (p->needInitState == 0))))
          {
            local_38 = status;
            LzmaDec_InitDicAndState(&p->decoder,(uint)(bVar6 == 3),(uint)(bVar6 != 0));
            p->needInitDic = 0;
            p->needInitState = 0;
            bVar17 = true;
            uVar10 = 7;
            srcLen = local_48;
            status = local_38;
          }
          else {
            unaff_R15D = 1;
            uVar10 = 9;
            bVar17 = false;
          }
          p->state = uVar10;
          bVar9 = true;
          SVar11 = local_50;
          src = local_40;
          SVar16 = unaff_R15D;
          if (!bVar17) goto LAB_005d1e92;
        }
        if (p->packSize < local_58) {
          local_58 = (ulong)p->packSize;
        }
        unaff_R15D = LzmaDec_DecodeToDic(&p->decoder,uVar13 + SVar4,src,&local_58,
                                         (uint)(uVar12 <= uVar8),status);
        *local_48 = *local_48 + local_58;
        src = src + local_58;
        UVar3 = p->packSize;
        p->packSize = UVar3 - (UInt32)local_58;
        SVar5 = (p->decoder).dicPos;
        UVar15 = ((int)SVar4 - (int)SVar5) + p->unpackSize;
        p->unpackSize = UVar15;
        bVar9 = true;
        srcLen = local_48;
        SVar11 = local_50;
        if (unaff_R15D == 0) {
          if (*status == LZMA_STATUS_NEEDS_MORE_INPUT) {
            unaff_R15D = 0;
          }
          else {
            if (local_58 == 0 && SVar4 == SVar5) {
              if (UVar3 != (UInt32)local_58 ||
                  (*status != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK || UVar15 != 0)) {
                p->state = 9;
                unaff_R15D = 1;
                goto LAB_005d1e92;
              }
              p->state = 0;
            }
            bVar9 = false;
            unaff_R15D = SVar16;
            if (*status == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) {
              *status = LZMA_STATUS_NOT_FINISHED;
            }
          }
        }
      }
      else if (SVar11 == *srcLen) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        unaff_R15D = 0;
LAB_005d1f03:
        bVar9 = true;
      }
      else {
        if (uVar10 == 6) {
          if (bVar6 == 1) {
            p->needInitState = 1;
            p->needInitProp = 1;
LAB_005d202d:
            p->needInitDic = 0;
            LzmaDec_InitDicAndState(&p->decoder,(uint)(bVar6 == 1),0);
            bVar9 = true;
            srcLen = local_48;
            SVar11 = local_50;
          }
          else {
            if (p->needInitDic == 0) goto LAB_005d202d;
            p->state = 9;
            unaff_R15D = 1;
            bVar9 = false;
          }
          if (!bVar9) goto LAB_005d1f03;
        }
        if (uVar13 < local_58) {
          local_58 = uVar13;
        }
        uVar8 = local_58;
        if (local_58 == 0) {
          p->state = 9;
          bVar9 = true;
          unaff_R15D = 1;
          SVar11 = local_50;
        }
        else {
          memcpy((p->decoder).dic + (p->decoder).dicPos,src,local_58);
          pSVar1 = &(p->decoder).dicPos;
          *pSVar1 = *pSVar1 + uVar8;
          if (((p->decoder).checkDicSize == 0) &&
             (UVar3 = (p->decoder).prop.dicSize, UVar3 - (p->decoder).processedPos <= uVar8)) {
            (p->decoder).checkDicSize = UVar3;
          }
          pUVar2 = &(p->decoder).processedPos;
          *pUVar2 = *pUVar2 + (int)uVar8;
          src = src + local_58;
          *local_48 = *local_48 + local_58;
          bVar9 = false;
          pUVar2 = &p->unpackSize;
          *pUVar2 = *pUVar2 - (int)local_58;
          uVar10 = 7;
          if (*pUVar2 == 0) {
            uVar10 = 0;
          }
          p->state = uVar10;
          srcLen = local_48;
          SVar11 = local_50;
        }
      }
    }
LAB_005d1e92:
    if (bVar9) {
      return unaff_R15D;
    }
    uVar10 = p->state;
  } while( true );
}

Assistant:

SRes Lzma2Dec_DecodeToDic(CLzma2Dec *p, SizeT dicLimit,
    const Byte *src, SizeT *srcLen, ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT inSize = *srcLen;
  *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->state != LZMA2_STATE_FINISHED)
  {
    SizeT dicPos = p->decoder.dicPos;
    
    if (p->state == LZMA2_STATE_ERROR)
      return SZ_ERROR_DATA;
    
    if (dicPos == dicLimit && finishMode == LZMA_FINISH_ANY)
    {
      *status = LZMA_STATUS_NOT_FINISHED;
      return SZ_OK;
    }

    if (p->state != LZMA2_STATE_DATA && p->state != LZMA2_STATE_DATA_CONT)
    {
      if (*srcLen == inSize)
      {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      (*srcLen)++;
      p->state = Lzma2Dec_UpdateState(p, *src++);

      if (dicPos == dicLimit && p->state != LZMA2_STATE_FINISHED)
      {
        p->state = LZMA2_STATE_ERROR;
        return SZ_ERROR_DATA;
      }
      continue;
    }
    
    {
      SizeT destSizeCur = dicLimit - dicPos;
      SizeT srcSizeCur = inSize - *srcLen;
      ELzmaFinishMode curFinishMode = LZMA_FINISH_ANY;
      
      if (p->unpackSize <= destSizeCur)
      {
        destSizeCur = (SizeT)p->unpackSize;
        curFinishMode = LZMA_FINISH_END;
      }

      if (LZMA2_IS_UNCOMPRESSED_STATE(p))
      {
        if (*srcLen == inSize)
        {
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }

        if (p->state == LZMA2_STATE_DATA)
        {
          Bool initDic = (p->control == LZMA2_CONTROL_COPY_RESET_DIC);
          if (initDic)
            p->needInitProp = p->needInitState = True;
          else if (p->needInitDic)
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          p->needInitDic = False;
          LzmaDec_InitDicAndState(&p->decoder, initDic, False);
        }

        if (srcSizeCur > destSizeCur)
          srcSizeCur = destSizeCur;

        if (srcSizeCur == 0)
        {
          p->state = LZMA2_STATE_ERROR;
          return SZ_ERROR_DATA;
        }

        LzmaDec_UpdateWithUncompressed(&p->decoder, src, srcSizeCur);

        src += srcSizeCur;
        *srcLen += srcSizeCur;
        p->unpackSize -= (UInt32)srcSizeCur;
        p->state = (p->unpackSize == 0) ? LZMA2_STATE_CONTROL : LZMA2_STATE_DATA_CONT;
      }
      else
      {
        SizeT outSizeProcessed;
        SRes res;

        if (p->state == LZMA2_STATE_DATA)
        {
          unsigned mode = LZMA2_GET_LZMA_MODE(p);
          Bool initDic = (mode == 3);
          Bool initState = (mode != 0);
          if ((!initDic && p->needInitDic) || (!initState && p->needInitState))
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          
          LzmaDec_InitDicAndState(&p->decoder, initDic, initState);
          p->needInitDic = False;
          p->needInitState = False;
          p->state = LZMA2_STATE_DATA_CONT;
        }
  
        if (srcSizeCur > p->packSize)
          srcSizeCur = (SizeT)p->packSize;
          
        res = LzmaDec_DecodeToDic(&p->decoder, dicPos + destSizeCur, src, &srcSizeCur, curFinishMode, status);
        
        src += srcSizeCur;
        *srcLen += srcSizeCur;
        p->packSize -= (UInt32)srcSizeCur;

        outSizeProcessed = p->decoder.dicPos - dicPos;
        p->unpackSize -= (UInt32)outSizeProcessed;

        RINOK(res);
        if (*status == LZMA_STATUS_NEEDS_MORE_INPUT)
          return res;

        if (srcSizeCur == 0 && outSizeProcessed == 0)
        {
          if (*status != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK
              || p->unpackSize != 0
              || p->packSize != 0)
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          p->state = LZMA2_STATE_CONTROL;
        }
        
        if (*status == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK)
          *status = LZMA_STATUS_NOT_FINISHED;
      }
    }
  }
  
  *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return SZ_OK;
}